

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O0

string * mg::string::bytes_to_hex(string *__return_storage_ptr__,string *bytes)

{
  byte nibble;
  char cVar1;
  ulong uVar2;
  byte *pbVar3;
  char *pcVar4;
  ulong uStack_38;
  uint8_t byte;
  size_type i;
  anon_class_1_0_00000001 nibble_to_hex;
  string *bytes_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  for (uStack_38 = 0; uVar2 = std::__cxx11::string::size(), uStack_38 < uVar2;
      uStack_38 = uStack_38 + 1) {
    pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)bytes);
    nibble = *pbVar3;
    cVar1 = bytes_to_hex::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&i + 3),nibble >> 4);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pcVar4 = cVar1;
    cVar1 = bytes_to_hex::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&i + 3),nibble);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pcVar4 = cVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string bytes_to_hex(const std::string &bytes) {
  std::string ret;
  ret.resize(bytes.size() * 2);
  auto nibble_to_hex = [](uint8_t nibble) -> char {
    nibble &= 0xF;
    if (nibble < 10)
      return '0' + nibble;
    return 'A' + (nibble - 10);
  };

  for (std::string::size_type i = 0; i < bytes.size(); i++) {
    uint8_t byte = bytes[i];
    ret[i * 2] = nibble_to_hex(byte >> 4);
    ret[i * 2 + 1] = nibble_to_hex(byte);
  }

  return ret;
}